

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void prepdelem(rnndb *db,rnndelem *elem,char *prefix,rnnvarinfo *parvi,int width)

{
  rnnvarinfo *vi;
  rnngroup *prVar1;
  char *b;
  int iVar2;
  rnndelem **pprVar3;
  rnndelem *prVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char **local_40;
  
  if (elem->type == RNN_ETYPE_USE_GROUP) {
    uVar7 = 0;
    uVar8 = (ulong)(uint)db->groupsnum;
    if (db->groupsnum < 1) {
      uVar8 = 0;
    }
    do {
      if (uVar8 == uVar7) {
        fprintf(_stderr,"group %s not found!\n",elem->name);
        db->estatus = 1;
        goto LAB_00106708;
      }
      prVar1 = db->groups[uVar7];
      iVar2 = strcmp(prVar1->name,elem->name);
      uVar7 = uVar7 + 1;
    } while (iVar2 != 0);
    for (lVar9 = 0; lVar9 < prVar1->subelemsnum; lVar9 = lVar9 + 1) {
      iVar2 = elem->subelemsmax;
      if (iVar2 <= elem->subelemsnum) {
        iVar6 = iVar2 * 2;
        if (iVar2 == 0) {
          iVar6 = 0x10;
        }
        elem->subelemsmax = iVar6;
        pprVar3 = (rnndelem **)realloc(elem->subelems,(long)iVar6 << 3);
        elem->subelems = pprVar3;
      }
      prVar4 = copydelem(prVar1->subelems[lVar9],elem->file);
      iVar2 = elem->subelemsnum;
      elem->subelemsnum = iVar2 + 1;
      elem->subelems[iVar2] = prVar4;
    }
LAB_00106708:
    elem->type = RNN_ETYPE_STRIPE;
    elem->length = 1;
    free(elem->name);
    elem->name = (char *)0x0;
  }
  else if (elem->name != (char *)0x0) {
    pcVar5 = catstr(prefix,elem->name);
    elem->fullname = pcVar5;
    goto LAB_0010673d;
  }
  pcVar5 = elem->fullname;
LAB_0010673d:
  local_40 = &elem->name;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = prefix;
  }
  vi = &elem->varinfo;
  prepvarinfo(db,pcVar5,vi,parvi);
  if ((elem->varinfo).dead == 0) {
    if ((elem->length != 1) && (elem->stride == 0)) {
      if (elem->type == RNN_ETYPE_REG) {
        elem->stride = (long)(elem->width / width);
      }
      else {
        fprintf(_stderr,"%s has non-1 length, but no stride!\n",elem->fullname);
        db->estatus = 1;
      }
    }
    pcVar5 = prefix;
    if (elem->name != (char *)0x0) {
      pcVar5 = elem->fullname;
    }
    preptypeinfo(db,&elem->typeinfo,pcVar5,vi,elem->width,elem->file);
    for (lVar9 = 0; lVar9 < elem->subelemsnum; lVar9 = lVar9 + 1) {
      pcVar5 = prefix;
      if (elem->name != (char *)0x0) {
        pcVar5 = elem->fullname;
      }
      prepdelem(db,elem->subelems[lVar9],pcVar5,vi,width);
    }
    pcVar5 = (elem->varinfo).prefix;
    if ((pcVar5 != (char *)0x0) && (*local_40 != (char *)0x0)) {
      b = elem->fullname;
      pcVar5 = catstr(pcVar5,b);
      elem->fullname = pcVar5;
      free(b);
      return;
    }
  }
  return;
}

Assistant:

static void prepdelem(struct rnndb *db, struct rnndelem *elem, char *prefix, struct rnnvarinfo *parvi, int width) {
	if (elem->type == RNN_ETYPE_USE_GROUP) {
		int i;
		struct rnngroup *gr = 0;
		for (i = 0; i < db->groupsnum; i++)
			if (!strcmp(db->groups[i]->name, elem->name)) {
				gr = db->groups[i];
				break;
			}
		if (gr) {
			for (i = 0; i < gr->subelemsnum; i++)
				ADDARRAY(elem->subelems, copydelem(gr->subelems[i], elem->file));
		} else {
			fprintf (stderr, "group %s not found!\n", elem->name);
			db->estatus = 1;
		}
		elem->type = RNN_ETYPE_STRIPE;
		elem->length = 1;
		free(elem->name);
		elem->name = 0;
	}
	if (elem->name)
		elem->fullname = catstr(prefix, elem->name);
	prepvarinfo (db, elem->fullname?elem->fullname:prefix, &elem->varinfo, parvi);
	if (elem->varinfo.dead)
		return;
	if (elem->length != 1 && !elem->stride) {
		if (elem->type != RNN_ETYPE_REG) {
			fprintf (stderr, "%s has non-1 length, but no stride!\n", elem->fullname);
			db->estatus = 1;
		} else {
			elem->stride = elem->width/width;
		}
	}
	preptypeinfo(db, &elem->typeinfo, elem->name?elem->fullname:prefix, &elem->varinfo, elem->width, elem->file);

	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		prepdelem(db,  elem->subelems[i], elem->name?elem->fullname:prefix, &elem->varinfo, width);
	if (elem->varinfo.prefix && elem->name) {
		char *tmp = elem->fullname;
		elem->fullname = catstr(elem->varinfo.prefix, elem->fullname);
		free(tmp);
	}
}